

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmLocalNinjaGenerator::WriteBuildFileTop(cmLocalNinjaGenerator *this)

{
  cmLocalNinjaGenerator *this_00;
  
  WriteProjectHeader(this,(ostream *)
                          (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                          GlobalGenerator[1]._vptr_cmGlobalGenerator);
  this_00 = this;
  WriteNinjaRequiredVersion
            (this,(ostream *)
                  (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                  _vptr_cmGlobalGenerator);
  WriteNinjaFilesInclusion
            (this_00,(ostream *)
                     (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                     _vptr_cmGlobalGenerator);
  WriteProjectHeader(this,*(ostream **)
                           &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                            GlobalGenerator[1].TryCompileTimeout);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteBuildFileTop()
{
  // For the build file.
  this->WriteProjectHeader(this->GetBuildFileStream());
  this->WriteNinjaRequiredVersion(this->GetBuildFileStream());
  this->WriteNinjaFilesInclusion(this->GetBuildFileStream());

  // For the rule file.
  this->WriteProjectHeader(this->GetRulesFileStream());
}